

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O2

buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> *
__thiscall
burst::
make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
          (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
           *__return_storage_ptr__,burst *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *range,
          int n)

{
  int in_R8D;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_28;
  undefined8 local_18;
  undefined4 local_10;
  burst local_c;
  
  local_18 = *(undefined8 *)this;
  local_10 = *(undefined4 *)(this + 8);
  local_c = this[0xc];
  local_28._M_stream = *(istream_type **)(this + 0x10);
  local_28._M_value = *(int *)(this + 0x18);
  local_28._M_ok = *(bool *)(this + 0x1c);
  make_buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>
            (__return_storage_ptr__,(burst *)&local_18,&local_28,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)
             ((ulong)range & 0xffffffff),in_R8D);
  return __return_storage_ptr__;
}

Assistant:

auto make_buffered_chunk_iterator (const Range & range, Integral n)
    {
        using std::begin;
        using std::end;
        return make_buffered_chunk_iterator(begin(range), end(range), n);
    }